

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O1

void __thiscall
presolve::HighsPostsolveStack::singletonRow
          (HighsPostsolveStack *this,HighsInt row,HighsInt col,double coef,bool tightenedColLower,
          bool tightenedColUpper)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  size_t position;
  ReductionType local_41;
  double local_40;
  unsigned_long local_38;
  
  iVar1 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[row];
  pcVar3 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = coef;
  std::vector<char,_std::allocator<char>_>::resize
            (&(this->reductionValues).data,(size_type)(pcVar3 + (0x18 - (long)pcVar4)));
  pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(double *)(pcVar3 + ((long)pcVar5 - (long)pcVar4)) = local_40;
  *(int *)(pcVar3 + (long)(pcVar5 + (8 - (long)pcVar4))) = iVar1;
  *(int *)(pcVar3 + (long)(pcVar5 + (0xc - (long)pcVar4))) = iVar2;
  pcVar3[(long)(pcVar5 + (0x10 - (long)pcVar4))] = tightenedColLower;
  pcVar3[(long)(pcVar5 + (0x11 - (long)pcVar4))] = tightenedColUpper;
  local_41 = kSingletonRow;
  local_38 = (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
  ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
            ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
              *)&this->reductions,&local_41,&local_38);
  return;
}

Assistant:

void singletonRow(HighsInt row, HighsInt col, double coef,
                    bool tightenedColLower, bool tightenedColUpper) {
    reductionValues.push(SingletonRow{coef, origRowIndex[row],
                                      origColIndex[col], tightenedColLower,
                                      tightenedColUpper});
    reductionAdded(ReductionType::kSingletonRow);
  }